

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  Phi *pPVar1;
  int iVar2;
  uint32_t uVar3;
  iterator iVar4;
  size_t sVar5;
  Instruction *instruction;
  size_t sVar6;
  long lVar7;
  TemporaryCopy temporary_copy;
  uint32_t local_94;
  key_type local_90 [4];
  SmallVector<unsigned_int,_8UL> local_80;
  size_t local_48;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  uint *local_38;
  
  this->current_emitting_block = block;
  if ((this->backend).requires_relaxed_precision_analysis == true) {
    sVar6 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
    local_40 = &(this->temporary_to_mirror_precision_alias)._M_h;
    lVar7 = 8;
    local_48 = sVar6;
    for (sVar5 = 0; sVar6 != sVar5; sVar5 = sVar5 + 1) {
      pPVar1 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
      if (sVar5 == 0) {
        iVar2 = *(int *)((long)&(pPVar1->local_variable).id + lVar7);
LAB_002748f6:
        local_90[0] = iVar2;
        iVar4 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_40,local_90);
        if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          local_80.super_VectorView<unsigned_int>.buffer_size = 0;
          local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
          local_80.buffer_capacity = 8;
          local_90[0] = 0x53;
          local_90[1] = 0;
          local_90[2] = 3;
          uVar3 = Compiler::expression_type_id
                            (&this->super_Compiler,
                             *(uint32_t *)
                              ((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 8));
          local_38 = (uint *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    ._M_cur + 8);
          temporary_copy.dst_id = uVar3;
          SmallVector<unsigned_int,_8UL>::push_back(&local_80,&temporary_copy.dst_id);
          SmallVector<unsigned_int,_8UL>::push_back
                    (&local_80,
                     (uint *)((long)iVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                    ._M_cur + 0xc));
          SmallVector<unsigned_int,_8UL>::push_back(&local_80,local_38);
          (*(this->super_Compiler)._vptr_Compiler[8])(this,local_90);
          SmallVector<unsigned_int,_8UL>::~SmallVector(&local_80);
          sVar6 = local_48;
        }
      }
      else {
        iVar2 = *(int *)((long)&(pPVar1->local_variable).id + lVar7);
        if (*(int *)((long)&pPVar1[-1].local_variable.id + lVar7) != iVar2) goto LAB_002748f6;
      }
      lVar7 = lVar7 + 0xc;
    }
  }
  instruction = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  for (lVar7 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc; lVar7 != 0
      ; lVar7 = lVar7 + -0xc) {
    temporary_copy = handle_instruction_precision(this,instruction);
    (*(this->super_Compiler)._vptr_Compiler[8])(this,instruction);
    if (temporary_copy.dst_id != 0) {
      local_80.super_VectorView<unsigned_int>.buffer_size = 0;
      local_80.super_VectorView<unsigned_int>.ptr = (uint *)&local_80.stack_storage;
      local_80.buffer_capacity = 8;
      local_90[0] = 0x53;
      local_90[1] = 0;
      local_90[2] = 3;
      local_94 = Compiler::expression_type_id(&this->super_Compiler,temporary_copy.src_id);
      SmallVector<unsigned_int,_8UL>::push_back(&local_80,&local_94);
      SmallVector<unsigned_int,_8UL>::push_back(&local_80,&temporary_copy.dst_id);
      SmallVector<unsigned_int,_8UL>::push_back(&local_80,&temporary_copy.src_id);
      this->block_temporary_hoisting = true;
      (*(this->super_Compiler)._vptr_Compiler[8])(this,local_90);
      this->block_temporary_hoisting = false;
      SmallVector<unsigned_int,_8UL>::~SmallVector(&local_80);
    }
    instruction = instruction + 1;
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (size_t i = 0, n = block.phi_variables.size(); i < n; i++)
		{
			auto &phi = block.phi_variables[i];

			// Ensure we only copy once. We know a-priori that this array will lay out
			// the same function variables together.
			if (i && block.phi_variables[i - 1].function_variable == phi.function_variable)
				continue;

			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}